

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HillClimbing.cpp
# Opt level: O2

Solution * HillClimbing::runHillClimbing(Solution *solution)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  SolutionNeighbourhood *this;
  Solution *solution_00;
  
  this = (SolutionNeighbourhood *)operator_new(0x40);
  SolutionNeighbourhood::SolutionNeighbourhood(this,solution);
  uVar2 = Validator::evaluateSolution(solution);
  while( true ) {
    solution_00 = SolutionNeighbourhood::getNext(this);
    if (solution_00 == (Solution *)0x0) break;
    bVar1 = SolutionNeighbourhood::hasEnded(this);
    if (bVar1) break;
    uVar3 = Validator::evaluateSolution(solution_00);
    if ((int)uVar3 < (int)uVar2) {
      std::_Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>::~_Vector_base
                (&(this->nurseVector).
                  super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>);
      operator_delete(this,0x40);
      this = (SolutionNeighbourhood *)operator_new(0x40);
      SolutionNeighbourhood::SolutionNeighbourhood(this,solution_00);
      uVar2 = uVar3;
    }
  }
  std::_Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>::~_Vector_base
            (&(this->nurseVector).
              super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>);
  operator_delete(this,0x40);
  return solution_00;
}

Assistant:

Solution* HillClimbing::runHillClimbing(Solution* solution){

    SolutionNeighbourhood* neighbourhood = new SolutionNeighbourhood(solution);

    int bestScore = Validator::evaluateSolution(*solution);

    //next will undo last move so it can reset the initial solution
    while((solution = neighbourhood->getNext()) && !neighbourhood->hasEnded())
    {
        int currentScore = Validator::evaluateSolution(*solution);
        if(bestScore > currentScore)
        {
            delete neighbourhood;
            neighbourhood = new SolutionNeighbourhood(solution);
            bestScore = currentScore;
        }
    }
    delete neighbourhood;
    return solution;
}